

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::rr_e(CPU *this)

{
  uint8_t *puVar1;
  Registers *pRVar2;
  byte bVar3;
  
  pRVar2 = this->regs;
  bVar3 = pRVar2->f;
  pRVar2->f = (pRVar2->e & 1) << 4;
  bVar3 = pRVar2->e >> 1 | (bVar3 & 0x10) << 3;
  pRVar2->e = bVar3;
  if (bVar3 == 0) {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 2;
}

Assistant:

int CPU::rr_e() {
    rr_r8(regs.e);
    return 2;
}